

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerArgIn(Lowerer *this,Instr *instrArgIn)

{
  OpCode OVar1;
  Opnd *pOVar2;
  Type pJVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  ArgSlot AVar7;
  ArgSlot AVar8;
  ArgSlot AVar9;
  undefined4 *puVar10;
  Opnd *dstOpnd;
  JITTimeFunctionBody *pJVar11;
  Instr *pIVar12;
  SymOpnd *pSVar13;
  StackSym *pSVar14;
  RegOpnd *pRVar15;
  Instr *pIVar16;
  LabelInstr *pLVar17;
  LabelInstr *branchTarget;
  BranchInstr *pBVar18;
  IntConstOpnd *pIVar19;
  Opnd *pOVar20;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  RegOpnd *pRVar21;
  LabelInstr *pLVar22;
  short sVar23;
  Instr *pIVar24;
  Func *this_01;
  Lowerer *this_02;
  ushort uVar25;
  RegOpnd *local_70;
  undefined4 *local_58;
  
  if (instrArgIn == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ce3,"(instrArgIn)","instrArgIn");
    if (!bVar5) goto LAB_00558660;
    *puVar10 = 0;
  }
  OVar1 = instrArgIn->m_opcode;
  if (OVar1 == ArgIn_Rest) {
    dstOpnd = IR::Instr::UnlinkDst(instrArgIn);
    pJVar11 = Func::GetJITFunctionBody(this->m_func);
    bVar5 = JITTimeFunctionBody::HasImplicitArgIns(pJVar11);
    this_01 = this->m_func;
    if ((!bVar5) || (this_01->argInsCount == 0)) {
      if (instrArgIn->m_func != this_01) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2cf9,"(instrArgIn->m_func == this->m_func)",
                           "instrArgIn->m_func == this->m_func");
        if (!bVar5) goto LAB_00558660;
        *puVar10 = 0;
        this_01 = this->m_func;
      }
      AVar7 = Func::GetInParamsCount(this_01);
      pIVar12 = LowererMD::LoadInputParamCount(&this->m_lowererMD,instrArgIn,-(uint)AVar7,false);
      pOVar2 = pIVar12->m_dst;
      pLVar17 = IR::LabelInstr::New(Label,this->m_func,false);
      this_02 = (Lowerer *)0x0;
      pIVar19 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertCompareBranch(this_02,pOVar2,&pIVar19->super_Opnd,BrGe_A,pLVar17,instrArgIn,false);
      pRVar15 = (RegOpnd *)0x0;
      pIVar19 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar2,&pIVar19->super_Opnd,instrArgIn,true);
      IR::Instr::InsertBefore(instrArgIn,&pLVar17->super_Instr);
      pJVar11 = Func::GetJITFunctionBody(this->m_func);
      bVar5 = JITTimeFunctionBody::IsCoroutine(pJVar11);
      if (bVar5) {
        bVar5 = Func::IsLoopBody(this->m_func);
        if (bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d0a,"(!m_func->IsLoopBody())",
                             "LoopBody Jit should not involve Rest params");
          if (!bVar5) goto LAB_00558660;
          *puVar10 = 0;
        }
        pRVar15 = LoadGeneratorArgsPtr(instrArgIn);
      }
      AVar7 = Func::GetInParamsCount(this->m_func);
      pIVar19 = IR::IntConstOpnd::New((ulong)AVar7,TyUint32,this->m_func,false);
      pIVar12 = LowerRestParameter(this,&pIVar19->super_Opnd,dstOpnd,pOVar2,instrArgIn,pRVar15);
      IR::Instr::Remove(instrArgIn);
      return pIVar12;
    }
    pIVar24 = instrArgIn;
    pIVar12 = (Instr *)0x0;
    while (pIVar24->m_opcode != ArgIn_A) {
      pIVar24 = pIVar24->m_prev;
      if (pIVar12 == (Instr *)0x0) {
        pIVar12 = pIVar24;
      }
    }
    IR::Instr::Remove(instrArgIn);
    instrArgIn = pIVar24;
  }
  else {
    dstOpnd = (Opnd *)0x0;
    pIVar12 = (Instr *)0x0;
  }
  pSVar13 = IR::Opnd::AsSymOpnd(instrArgIn->m_src1);
  pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
  AVar7 = StackSym::GetParamSlotNum(pSVar14);
  if (AVar7 == 1) {
    pJVar11 = Func::GetJITFunctionBody(this->m_func);
    bVar5 = JITTimeFunctionBody::IsCoroutine(pJVar11);
    if ((bVar5) && (bVar5 = Func::IsLoopBody(this->m_func), !bVar5)) {
      pRVar15 = LoadGeneratorArgsPtr(instrArgIn);
      ConvertArgOpndIfGeneratorFunction(this,instrArgIn,pRVar15);
    }
    LowererMD::ChangeToAssign(instrArgIn);
    if (pIVar12 == (Instr *)0x0) {
      pIVar12 = instrArgIn->m_prev;
    }
    return pIVar12;
  }
  AVar8 = Func::GetInParamsCount(this->m_func);
  if (AVar8 < AVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2d28,"(argIndex <= formalsCount)",
                       "Expect to see the ArgIn\'s within the range of the formals");
    if (!bVar5) goto LAB_00558660;
    *puVar10 = 0;
  }
  if (this->m_func->argInsCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_58 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2d30,"(this->m_func->argInsCount > 0)","this->m_func->argInsCount > 0");
    if (!bVar5) {
LAB_00558660:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *local_58 = 0;
  }
  else {
    local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  uVar25 = 0;
  pIVar24 = instrArgIn;
  do {
LAB_00557fe2:
    if ((int)(this->m_func->argInsCount - 1) <= (int)(uint)uVar25) {
      if (pIVar12 == (Instr *)0x0) {
        pIVar12 = pIVar24->m_prev;
      }
      pJVar11 = Func::GetJITFunctionBody(this->m_func);
      bVar5 = JITTimeFunctionBody::IsCoroutine(pJVar11);
      if (bVar5) {
        local_70 = LoadGeneratorArgsPtr(pIVar24);
      }
      else {
        local_70 = (RegOpnd *)0x0;
      }
      pIVar16 = LowererMD::LoadInputParamCount(&this->m_lowererMD,pIVar24,-(uint)AVar8,true);
      pOVar2 = pIVar16->m_dst;
      pLVar17 = IR::LabelInstr::New(Label,this->m_func,true);
      InsertBranch(BrLt_A,pLVar17,pIVar24);
      branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
      pBVar18 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(pIVar24,&pBVar18->super_Instr);
      IR::Instr::InsertBefore(pIVar24,&pLVar17->super_Instr);
      IR::Instr::InsertBefore(pIVar24,&branchTarget->super_Instr);
      pSVar13 = IR::Opnd::AsSymOpnd(instrArgIn->m_src1);
      pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
      AVar7 = StackSym::GetParamSlotNum(pSVar14);
      AVar9 = Func::GetInParamsCount(this->m_func);
      for (sVar23 = AVar7 - AVar9; sVar23 != 0; sVar23 = sVar23 + 1) {
        pIVar19 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
        InsertAdd(true,pOVar2,pOVar2,&pIVar19->super_Opnd,&branchTarget->super_Instr);
        InsertBranch(BrEq_A,branchTarget,&branchTarget->super_Instr);
      }
      pOVar20 = LoadLibraryValueOpnd(this,&branchTarget->super_Instr,ValueUndefined);
      pRVar15 = IR::RegOpnd::New(TyUint64,this->m_func);
      InsertMove(&pRVar15->super_Opnd,pOVar20,&branchTarget->super_Instr,true);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->m_alloc,0x3d6ef4);
      pJVar3 = this->m_alloc;
      this_00->head = (Type_conflict)0x0;
      this_00->lastFoundIndex = (Type_conflict)0x0;
      this_00->alloc = pJVar3;
      this_00->lastUsedNodePrevNextField = (Type)this_00;
      pLVar17 = branchTarget;
      do {
        pOVar20 = instrArgIn->m_dst;
        bVar5 = IR::Opnd::IsRegOpnd(pOVar20);
        if (uVar25 == 0) {
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_58 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2dc9,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
            if (!bVar5) goto LAB_00558660;
            *local_58 = 0;
          }
          pRVar21 = IR::Opnd::AsRegOpnd(pOVar20);
          pSVar14 = Sym::AsStackSym(&pRVar21->m_sym->super_Sym);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,(pSVar14->super_Sym).m_id)
          ;
          InsertMove(pOVar20,&pRVar15->super_Opnd,&branchTarget->super_Instr,true);
          if (OVar1 == ArgIn_Rest) {
            pIVar19 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
            InsertMove(pOVar2,&pIVar19->super_Opnd,&branchTarget->super_Instr,true);
          }
          pLVar22 = IR::LabelInstr::New(Label,this->m_func,false);
          pBVar18 = IR::BranchInstr::New(JMP,pLVar22,this->m_func);
          IR::Instr::InsertBefore(&branchTarget->super_Instr,&pBVar18->super_Instr);
          IR::Instr::InsertAfter(&pLVar17->super_Instr,&pLVar22->super_Instr);
          if (OVar1 == ArgIn_Rest) {
            AVar7 = Func::GetInParamsCount(this->m_func);
            pIVar19 = IR::IntConstOpnd::New((ulong)AVar7,TyUint32,this->m_func,false);
            LowerRestParameter(this,&pIVar19->super_Opnd,dstOpnd,pOVar2,&pLVar22->super_Instr,
                               local_70);
          }
          IR::Instr::Unlink(instrArgIn);
          if (BVar6 == '\0') {
            ConvertArgOpndIfGeneratorFunction(this,instrArgIn,local_70);
            IR::Instr::InsertBefore(&pLVar22->super_Instr,instrArgIn);
            LowererMD::ChangeToAssign(instrArgIn);
          }
          else {
            IR::Instr::Free(instrArgIn);
          }
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->m_alloc,this_00);
          return pIVar12;
        }
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_58 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d80,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar5) goto LAB_00558660;
          *local_58 = 0;
        }
        pRVar21 = IR::Opnd::AsRegOpnd(pOVar20);
        pSVar14 = Sym::AsStackSym(&pRVar21->m_sym->super_Sym);
        BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,(pSVar14->super_Sym).m_id);
        InsertMove(pOVar20,&pRVar15->super_Opnd,&branchTarget->super_Instr,true);
        pLVar22 = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(&pLVar17->super_Instr,&pLVar22->super_Instr);
        pIVar24 = instrArgIn->m_prev;
        IR::Instr::Unlink(instrArgIn);
        pSVar13 = IR::Opnd::AsSymOpnd(instrArgIn->m_src1);
        pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
        AVar7 = StackSym::GetParamSlotNum(pSVar14);
        if (BVar6 == '\0') {
          ConvertArgOpndIfGeneratorFunction(this,instrArgIn,local_70);
          IR::Instr::InsertBefore(&pLVar22->super_Instr,instrArgIn);
          LowererMD::ChangeToAssign(instrArgIn);
        }
        else {
          IR::Instr::Free(instrArgIn);
        }
        uVar25 = uVar25 - 1;
        instrArgIn = pIVar24;
        while (instrArgIn->m_opcode != ArgIn_A) {
          instrArgIn = instrArgIn->m_prev;
          if (instrArgIn == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_58 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2daf,"(instrArgIn)","???");
            if (!bVar5) goto LAB_00558660;
            *local_58 = 0;
          }
        }
        pSVar13 = IR::Opnd::AsSymOpnd(instrArgIn->m_src1);
        pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
        AVar9 = StackSym::GetParamSlotNum(pSVar14);
        if (AVar7 == AVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_58 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2db6,"(diffSlotsNum > 0)","Argins are not in order?");
          if (!bVar5) goto LAB_00558660;
          *local_58 = 0;
        }
        for (sVar23 = AVar9 - AVar7; sVar23 != 0; sVar23 = sVar23 + 1) {
          pIVar19 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
          InsertAdd(true,pOVar2,pOVar2,&pIVar19->super_Opnd,&branchTarget->super_Instr);
          InsertBranch(BrEq_A,pLVar22,&branchTarget->super_Instr);
        }
        pSVar13 = IR::Opnd::AsSymOpnd(instrArgIn->m_src1);
        pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
        AVar7 = StackSym::GetParamSlotNum(pSVar14);
        pLVar17 = pLVar22;
        if (AVar8 < AVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_58 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2dc0,
                             "(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount)"
                             ,"Expect all ArgIn\'s to be in numerical order by param slot");
          if (!bVar5) goto LAB_00558660;
          *local_58 = 0;
        }
      } while( true );
    }
    pIVar24 = pIVar24->m_prev;
    if (pIVar24->m_opcode != ArgIn_A) {
      if (pIVar12 == (Instr *)0x0) {
        pIVar12 = pIVar24;
      }
      goto LAB_00557fe2;
    }
    pSVar13 = IR::Opnd::AsSymOpnd(pIVar24->m_src1);
    pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
    AVar9 = StackSym::GetParamSlotNum(pSVar14);
    if (AVar7 <= AVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_58 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d39,"(symParam->GetParamSlotNum() < argIndex)",
                         "ArgIn\'s not in numerical order");
      if (!bVar5) goto LAB_00558660;
      *local_58 = 0;
    }
    AVar7 = StackSym::GetParamSlotNum(pSVar14);
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

IR::Instr *
Lowerer::LowerArgIn(IR::Instr *instrArgIn)
{
    IR::LabelInstr *   labelDone;
    IR::LabelInstr *   labelUndef;
    IR::LabelInstr *   labelNormal;
    IR::LabelInstr *   labelInit;
    IR::LabelInstr *   labelInitNext;
    IR::BranchInstr *  instrBranch;
    IR::Instr *        instrArgInNext;
    IR::Instr *        instrInsert;
    IR::Instr *        instrPrev;
    IR::Instr *        instrResume = nullptr;
    IR::Opnd *         dstOpnd;
    IR::Opnd *         srcOpnd;
    IR::Opnd *         opndUndef;
    Js::ArgSlot        argIndex;
    StackSym *         symParam;
    BOOLEAN            isDuplicate;
    IR::RegOpnd *      generatorArgsPtrOpnd = nullptr;

    // We start with:
    // s1 = ArgIn_A param1
    // s2 = ArgIn_A param2
    // ...
    // sn = ArgIn_A paramn
    //
    // We want to end up with:
    //
    // s1 = ArgIn_A param1            -- Note that this is unconditional
    // count = (load from param area)
    //     BrLt_A $start, count, n    -- Forward cbranch to the uncommon case
    //     Br $Ln
    // $start:
    //     sn = assign undef
    //     BrGe_A $Ln-1, count, n-1
    //     sn-1 = assign undef
    // ...
    //     s2 = assign undef
    //     Br $done
    // $Ln:
    //     sn = assign paramn
    // $Ln-1:
    //     sn-1 = assign paramn-1
    // ...
    //     s2 = assign param2
    // $done:

    AnalysisAssert(instrArgIn);

    IR::Opnd *restDst = nullptr;
    bool hasRest = instrArgIn->m_opcode == Js::OpCode::ArgIn_Rest;
    if (hasRest)
    {
        IR::Instr *restInstr = instrArgIn;
        restDst = restInstr->UnlinkDst();
        if (m_func->GetJITFunctionBody()->HasImplicitArgIns() && m_func->argInsCount > 0)
        {
            while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
            {
                instrArgIn = instrArgIn->m_prev;
                if (instrResume == nullptr)
                {
                    instrResume = instrArgIn;
                }
            }
            restInstr->Remove();
        }
        else
        {
            Assert(instrArgIn->m_func == this->m_func);
            IR::Instr * instrCount = m_lowererMD.LoadInputParamCount(instrArgIn, -this->m_func->GetInParamsCount());
            IR::Opnd * excessOpnd = instrCount->GetDst();

            IR::LabelInstr *createRestArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

            // BrGe $createRestArray, excess, 0
            InsertCompareBranch(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), Js::OpCode::BrGe_A, createRestArrayLabel, instrArgIn);

            // MOV excess, 0
            InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), instrArgIn);

            // $createRestArray
            instrArgIn->InsertBefore(createRestArrayLabel);

            if (m_func->GetJITFunctionBody()->IsCoroutine())
            {
                AssertMsg(!m_func->IsLoopBody(), "LoopBody Jit should not involve Rest params");
                generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            }

            IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
            IR::Instr *prev = LowerRestParameter(formalsOpnd, restDst, excessOpnd, instrArgIn, generatorArgsPtrOpnd);
            instrArgIn->Remove();
            return prev;
        }
    }

    srcOpnd = instrArgIn->GetSrc1();
    symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();

    argIndex = symParam->GetParamSlotNum();
    if (argIndex == 1)
    {
        // The "this" argument is not source-dependent and doesn't need to be checked.
        if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
        {
            generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        }

        m_lowererMD.ChangeToAssign(instrArgIn);
        return instrResume == nullptr ? instrArgIn->m_prev : instrResume;
    }

    Js::ArgSlot formalsCount = this->m_func->GetInParamsCount();

    AssertMsg(argIndex <= formalsCount, "Expect to see the ArgIn's within the range of the formals");

    // Because there may be instructions between the ArgIn's, such as saves to the frame object,
    // we find the top of the sequence of ArgIn's and insert everything there. This assumes that
    // ArgIn's use param symbols as src's and not the results of previous instructions.

    instrPrev = instrArgIn;
    Js::ArgSlot currArgInCount = 0;
    Assert(this->m_func->argInsCount > 0);

    while (currArgInCount < this->m_func->argInsCount - 1)
    {
        instrPrev = instrPrev->m_prev;
        if (instrPrev->m_opcode == Js::OpCode::ArgIn_A)
        {
            srcOpnd = instrPrev->GetSrc1();
            symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
            AssertMsg(symParam->GetParamSlotNum() < argIndex, "ArgIn's not in numerical order");
            argIndex = symParam->GetParamSlotNum();
            currArgInCount++;
        }
        else
        {
            // Make sure that this instruction gets lowered.
            if (instrResume == nullptr)
            {
                instrResume = instrPrev;
            }
        }
    }
    // The loading of parameters will be inserted above this instruction.
    instrInsert = instrPrev;

    AnalysisAssert(instrInsert);
    if (instrResume == nullptr)
    {
        // We found no intervening non-ArgIn's, so lowering can resume at the previous instruction.
        instrResume = instrInsert->m_prev;
    }

    // Now insert all the checks and undef-assigns.

    if (m_func->GetJITFunctionBody()->IsCoroutine())
    {
        generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrInsert);
    }

    // excessOpnd = (load from param area) - formalCounts
    IR::Instr * instrCount = this->m_lowererMD.LoadInputParamCount(instrInsert, -formalsCount, true);
    IR::Opnd * excessOpnd = instrCount->GetDst();

    labelUndef = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, /*helperLabel*/ true);
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, labelUndef, instrInsert);

    //     Br $Ln

    labelNormal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    labelInit = labelNormal;
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelNormal, this->m_func);
    instrInsert->InsertBefore(instrBranch);

    // Insert the labels

    instrInsert->InsertBefore(labelUndef);
    instrInsert->InsertBefore(labelNormal);

    //Adjustment for deadstore of ArgIn_A
    Js::ArgSlot highestSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
    Js::ArgSlot missingSlotNums = this->m_func->GetInParamsCount() - highestSlotNum;
    Assert(missingSlotNums >= 0);
    while (missingSlotNums > 0)
    {
        InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
        Lowerer::InsertBranch(Js::OpCode::BrEq_A, labelNormal, labelNormal);
        missingSlotNums--;
    }

    // MOV undefReg, undefAddress
    IR::Opnd* opndUndefAddress = this->LoadLibraryValueOpnd(labelNormal, LibraryValue::ValueUndefined);
    opndUndef =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    Lowerer::InsertMove(opndUndef, opndUndefAddress, labelNormal);

    BVSparse<JitArenaAllocator> *formalsBv = JitAnew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);

    while (currArgInCount > 0)
    {
        dstOpnd = instrArgIn->GetDst();

        Assert(dstOpnd->IsRegOpnd());
        isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

        // Now insert the undef initialization before the "normal" label

        //     sn = assign undef

        Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

        //     INC excessOpnd
        //     BrEq_A $Ln-1

        currArgInCount--;

        labelInitNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        // And insert the "normal" initialization before the "done" label

        //     sn = assign paramn
        // $Ln-1:

        labelInit->InsertAfter(labelInitNext);
        labelInit = labelInitNext;

        instrArgInNext = instrArgIn->m_prev;
        instrArgIn->Unlink();

        Js::ArgSlot prevParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

        //      function foo(x, x)  { use(x); }
        // This should refer to the second 'x'.  Since we reverse the order here however, we need to skip
        // the initialization of the first 'x' to not override the one for the second.  WOOB:1105504
        if (isDuplicate)
        {
            instrArgIn->Free();
        }
        else
        {
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
            labelInit->InsertBefore(instrArgIn);
            this->m_lowererMD.ChangeToAssign(instrArgIn);
        }
        instrArgIn = instrArgInNext;

        while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
        {
            instrArgIn = instrArgIn->m_prev;
            AssertMsg(instrArgIn, "???");
        }

        //Adjustment for deadstore of ArgIn_A
        Js::ArgSlot currParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
        Js::ArgSlot diffSlotsNum = prevParamSlotNum - currParamSlotNum;

        AssertMsg(diffSlotsNum > 0, "Argins are not in order?");

        while (diffSlotsNum > 0)
        {
            InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
            InsertBranch(Js::OpCode::BrEq_A, labelInitNext, labelNormal);
            diffSlotsNum--;
        }

        AssertMsg(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount,
                  "Expect all ArgIn's to be in numerical order by param slot");
    }

    // Insert final undef and normal initializations, jumping unconditionally to the end
    // rather than checking against the decremented formals count as we did inside the loop above.

    //     s2 = assign undef

    dstOpnd = instrArgIn->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

    Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

    if (hasRest)
    {
        InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), labelNormal);
    }

    //     Br $done

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    labelNormal->InsertBefore(instrBranch);

    //     s2 = assign param2
    // $done:

    labelInit->InsertAfter(labelDone);

    if (hasRest)
    {
        // The formals count has been tainted, so restore it before lowering rest
        IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
        LowerRestParameter(formalsOpnd, restDst, excessOpnd, labelDone, generatorArgsPtrOpnd);
    }

    instrArgIn->Unlink();
    if (isDuplicate)
    {
        instrArgIn->Free();
    }
    else
    {
        ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        labelDone->InsertBefore(instrArgIn);
        this->m_lowererMD.ChangeToAssign(instrArgIn);
    }

    JitAdelete(this->m_alloc, formalsBv);

    return instrResume;
}